

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

Variant * Jinx::operator+(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  ValueType VVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *pbVar4;
  int64_t iVar5;
  int64_t iVar6;
  char *format;
  undefined8 uVar7;
  double dVar8;
  double dVar9;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_78;
  String local_58;
  String local_38;
  
  VVar2 = left->m_type;
  if (VVar2 == Number) {
    if (right->m_type - Number < 2) {
LAB_0011f64a:
      __return_storage_ptr__->m_type = Null;
      dVar8 = Variant::GetNumber(left);
      dVar9 = Variant::GetNumber(right);
      Variant::Destroy(__return_storage_ptr__);
      __return_storage_ptr__->m_type = Number;
      (__return_storage_ptr__->field_1).m_number = dVar8 + dVar9;
      return __return_storage_ptr__;
    }
  }
  else {
    if (VVar2 != Integer) {
      if (VVar2 == String) {
        __return_storage_ptr__->m_type = Null;
        Variant::GetString_abi_cxx11_(&local_38,left);
        Variant::GetString_abi_cxx11_(&local_58,right);
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          uVar7 = local_38.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_58._M_string_length + local_38._M_string_length) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            uVar7 = local_58.field_2._M_allocated_capacity;
          }
          if (local_58._M_string_length + local_38._M_string_length <= (ulong)uVar7) {
            pbVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::replace
                               (&local_58,0,0,local_38._M_dataplus._M_p,local_38._M_string_length);
            goto LAB_0011f6c9;
          }
        }
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
                 _M_append(&local_38,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_0011f6c9:
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar1 = &pbVar4->field_2;
        if (paVar3 == paVar1) {
          local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_78._M_dataplus._M_p = (pointer)paVar3;
        }
        local_78._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar4->_M_string_length = 0;
        paVar1->_M_local_buf[0] = '\0';
        Variant::Destroy(__return_storage_ptr__);
        __return_storage_ptr__->m_type = String;
        (__return_storage_ptr__->field_1).m_collection.
        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)((long)&__return_storage_ptr__->field_1 + 0x10);
        (__return_storage_ptr__->field_1).m_string._M_string_length = 0;
        *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_assign
                  (&(__return_storage_ptr__->field_1).m_string,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          MemFree(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          MemFree(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          return __return_storage_ptr__;
        }
        MemFree(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      format = "Invalid left operand for addition";
      goto LAB_0011f6a4;
    }
    if (right->m_type == Number) goto LAB_0011f64a;
    if (right->m_type == Integer) {
      __return_storage_ptr__->m_type = Null;
      iVar5 = Variant::GetInteger(left);
      iVar6 = Variant::GetInteger(right);
      Variant::Destroy(__return_storage_ptr__);
      __return_storage_ptr__->m_type = Integer;
      (__return_storage_ptr__->field_1).m_collection.
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)(iVar6 + iVar5);
      return __return_storage_ptr__;
    }
  }
  format = "Invalid right operand for addition";
LAB_0011f6a4:
  Impl::LogWriteLine(Error,format);
  __return_storage_ptr__->m_type = Null;
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator + (const Variant & left, const Variant & right)
	{
		if (left.GetType() == ValueType::String)
		{
			Variant result;
			result.SetString(left.GetString() + right.GetString());
			return result;
		}
		if (left.GetType() != ValueType::Number && left.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for addition");
			return Variant();
		}
		if (right.GetType() != ValueType::Number && right.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for addition");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			result.SetInteger(left.GetInteger() + right.GetInteger());
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() + right.GetNumber());
			return result;
		}
	}